

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::StreamingListener::OnTestCaseStart(StreamingListener *this,TestCase *test_case)

{
  char *pcVar1;
  String *this_00;
  String local_48;
  String local_38 [2];
  TestCase *local_18;
  TestCase *test_case_local;
  StreamingListener *this_local;
  
  local_18 = test_case;
  test_case_local = (TestCase *)this;
  pcVar1 = TestCase::name(test_case);
  this_00 = &local_48;
  String::Format(this_00,"event=TestCaseStart&name=%s\n",pcVar1);
  String::operator_cast_to_string(local_38);
  Send(this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  String::~String(this_00);
  return;
}

Assistant:

void OnTestCaseStart(const TestCase& test_case) {
    Send(String::Format("event=TestCaseStart&name=%s\n", test_case.name()));
  }